

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotExec.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  GameMode GVar4;
  int extraout_EAX;
  UnitNode *pUVar5;
  int iVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  Map *map;
  long lVar10;
  byte bVar11;
  _Bool progress [10];
  Path path;
  Windows windows;
  UnitList guards;
  MapList mapList;
  Dialog dialog [10];
  undefined8 auStack_7868 [187];
  undefined4 local_7290;
  int local_727c;
  UnitList local_7278;
  _Bool local_725a [10];
  Path local_7250;
  Windows local_7240;
  UnitList local_7220;
  undefined8 local_7208 [187];
  undefined4 local_6c30;
  MapList local_6c2c;
  Dialog local_3ac8 [10];
  
  bVar11 = 0;
  parseMap(argv[1],&local_6c2c,local_3ac8);
  uiInit(&local_7240);
  GVar4 = menuMain(&local_7240);
  if (GVar4 != EXIT) {
    local_727c = 0;
    do {
      if (GVar4 != NEW) {
        local_727c = levelSelect(&local_7240,&local_6c2c,local_725a);
      }
      iVar2 = local_727c;
      lVar10 = (long)local_727c;
      map = local_6c2c.level + lVar10;
      memcpy(local_7208,local_3ac8 + lVar10,0x5dc);
      puVar8 = local_7208;
      puVar9 = auStack_7868;
      for (lVar7 = 0xbb; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      local_7290 = local_6c30;
      drawText(&local_7240,GVar4);
      memcpy(local_7208,map,0x4f0);
      puVar8 = local_7208;
      puVar9 = auStack_7868;
      for (lVar7 = 0x9e; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      getGuards(&local_7220);
      memcpy(local_7208,map,0x4f0);
      puVar8 = local_7208;
      puVar9 = auStack_7868;
      for (lVar7 = 0x9e; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      getPath(&local_7250);
      local_7278.head = (UnitNode *)0x0;
      local_7278.tail = (UnitNode *)0x0;
      local_7278.count = 0;
      drawLevel(&local_7240,map,&local_7220);
      drawInmateSelection(&local_7240,map,&local_7278,&local_7220);
      pUVar5 = getHead(&local_7278);
      if (0 < local_7278.count) {
        iVar1 = (local_7250.first)->location;
        iVar6 = local_7278.count;
        do {
          *(float *)((long)pUVar5->unit + 4) = (float)iVar1;
          pUVar5 = pUVar5->next;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      _Var3 = simulate(&local_7240,&local_7220,&local_7278,&local_7250);
      local_725a[lVar10] = _Var3;
      memcpy(local_7208,local_3ac8 + lVar10,0x5dc);
      puVar8 = local_7208;
      puVar9 = auStack_7868;
      for (lVar7 = 0xbb; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      local_7290 = local_6c30;
      drawText(&local_7240,_Var3 ^ 0x65);
    } while ((iVar2 != 0x65) && (GVar4 = WIN, _Var3));
  }
  uiFree(&local_7240);
  quit("Thanks for playing.\n");
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv) {
    enum GameMode gameMode;
    struct Windows windows;
    struct MapList mapList;
    struct Map *map;
    struct Dialog dialog[MAX_LEVELS];
    struct UnitList inmates, guards;
    struct UnitNode *unitNode;
    struct Path path;
    bool progress[MAX_LEVELS];
    int level=0;

    /* Parse map files */
    parseMap(argv[1], &mapList, dialog);

    /* Create nCurses WINDOWs */
    uiInit(&windows);

    /* Present user with main menu */
    gameMode = menuMain(&windows);

    do{
        if(gameMode==EXIT){
            break;
        } else if (gameMode!=NEW){
            level = levelSelect(&windows, &mapList, progress);
        }

        /* Select current map */
        map = &(mapList).level[level];

        /* Display intro text */
        drawText(&windows, dialog[level], gameMode);

        /* Initialize game elements */
        getGuards(&guards, *map);
        getPath(&path, *map);
        inmates.count = 0;
        inmates.head = NULL;
        inmates.tail = NULL;

        /* Draw level */
        drawLevel(&windows, map, &guards);

        /* Prompt user for unit selection */
        drawInmateSelection(&windows, map, &inmates, &guards);

        unitNode = getHead(&inmates);
        for (int i = 0; i < inmates.count; i++) {
            ((struct Inmate *) unitNode->unit)->position = path.first->location;
            unitNode = unitNode->next;
        }

        /* Simulate unit interactions */
        progress[level] = simulate(&windows, &guards, &inmates, &path);
        if(progress[level]) gameMode=WIN;
        else gameMode=LOSE;

        /* Display outro text */
        drawText(&windows, dialog[level], gameMode);

    } while (level!=EXIT);

    uiFree(&windows);
    quit("Thanks for playing.\n");

    return 0;
}